

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::AggressiveDCEPass::AddOperandsToWorkList(AggressiveDCEPass *this,Instruction *inst)

{
  pointer pOVar1;
  uint **ppuVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  bool bVar3;
  char cVar4;
  uint32_t uVar5;
  Instruction *inst_00;
  uint **ppuVar6;
  pointer pOVar7;
  AggressiveDCEPass **local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  uint *local_60;
  AggressiveDCEPass *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_88 = &local_58;
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:542:21)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:542:21)>
             ::_M_manager;
  uStack_80 = 0;
  pcStack_70 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:838:17)>
             ::_M_manager;
  pOVar1 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  for (pOVar7 = (inst->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar1; pOVar7 = pOVar7 + 1) {
    bVar3 = spvIsInIdType(pOVar7->type);
    if (bVar3) {
      ppuVar2 = (uint **)(pOVar7->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar6 = &(pOVar7->words).small_data_;
      if (ppuVar2 != (uint **)0x0) {
        ppuVar6 = ppuVar2;
      }
      local_60 = *ppuVar6;
      if (local_78 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      cVar4 = (*pcStack_70)(&local_88);
      if (cVar4 == '\0') break;
    }
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if ((inst->has_type_id_ == true) &&
     (uVar5 = Instruction::GetSingleWordOperand(inst,0), uVar5 != 0)) {
    this_00 = (this->super_MemPass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar5 = 0;
    if (inst->has_type_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(inst,0);
    }
    inst_00 = analysis::DefUseManager::GetDef(this_01,uVar5);
    AddToWorklist(this,inst_00);
  }
  return;
}

Assistant:

void AggressiveDCEPass::AddOperandsToWorkList(const Instruction* inst) {
  inst->ForEachInId([this](const uint32_t* iid) {
    Instruction* inInst = get_def_use_mgr()->GetDef(*iid);
    AddToWorklist(inInst);
  });
  if (inst->type_id() != 0) {
    AddToWorklist(get_def_use_mgr()->GetDef(inst->type_id()));
  }
}